

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_scan.cpp
# Opt level: O2

bool __thiscall
duckdb::PhysicalPositionalScan::Equals(PhysicalPositionalScan *this,PhysicalOperator *other_p)

{
  PhysicalOperator *pPVar1;
  int iVar2;
  PhysicalPositionalScan *pPVar3;
  const_reference pvVar4;
  size_t i;
  ulong __n;
  bool bVar5;
  
  if (((this->super_PhysicalOperator).type == other_p->type) &&
     (pPVar3 = PhysicalOperator::Cast<duckdb::PhysicalPositionalScan>(other_p),
     (long)(this->child_tables).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish -
     (long)(this->child_tables).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
     (long)(pPVar3->child_tables).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish -
     (long)(pPVar3->child_tables).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_start)) {
    __n = 0;
    do {
      bVar5 = (ulong)((long)(this->child_tables).
                            super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                            .
                            super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->child_tables).
                            super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                            .
                            super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n;
      if (bVar5) {
        return bVar5;
      }
      pvVar4 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                         (&this->child_tables,__n);
      pPVar1 = pvVar4->_M_data;
      pvVar4 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                         (&pPVar3->child_tables,__n);
      iVar2 = (*pPVar1->_vptr_PhysicalOperator[6])(pPVar1,pvVar4->_M_data);
      __n = __n + 1;
    } while ((char)iVar2 != '\0');
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool PhysicalPositionalScan::Equals(const PhysicalOperator &other_p) const {
	if (type != other_p.type) {
		return false;
	}

	auto &other = other_p.Cast<PhysicalPositionalScan>();
	if (child_tables.size() != other.child_tables.size()) {
		return false;
	}
	for (size_t i = 0; i < child_tables.size(); ++i) {
		if (!child_tables[i].get().Equals(other.child_tables[i])) {
			return false;
		}
	}

	return true;
}